

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method.h
# Opt level: O0

void __thiscall
iqxmlrpc::Method_dispatcher_base::Method_dispatcher_base(Method_dispatcher_base *this)

{
  Method_dispatcher_base *this_local;
  
  this->_vptr_Method_dispatcher_base = (_func_int **)&PTR__Method_dispatcher_base_00251ea8;
  return;
}

Assistant:

class LIBIQXMLRPC_API Method_dispatcher_base {
public:
  virtual ~Method_dispatcher_base() {}

  Method* create_method(const Method::Data& data)
  {
    Method *method = do_create_method(data.method_name);
    if (method)
      method->data_ = data;

    return method;
  }

  void get_methods_list(Array& retval) const
  {
    do_get_methods_list(retval);
  }

private:
  virtual Method*
  do_create_method(const std::string&) = 0;

  virtual void
  do_get_methods_list(Array&) const = 0;
}